

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_timeout.cxx
# Opt level: O1

void __thiscall nuraft::raft_server::enable_hb_for_peer(raft_server *this,peer *p)

{
  element_type *peVar1;
  int iVar2;
  string local_40;
  
  if (((p->abandoned_)._M_base._M_i & 1U) == 0) {
    p->hb_enabled_ = true;
  }
  LOCK();
  (p->current_hb_interval_).super___atomic_base<int>._M_i = p->hb_interval_;
  UNLOCK();
  peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar2 = (*peVar1->_vptr_logger[7])();
    if (5 < iVar2) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                (&local_40,"peer %d, interval: %d\n",
                 (ulong)(uint)((p->config_).
                               super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->id_,
                 (ulong)(uint)(p->current_hb_interval_).super___atomic_base<int>._M_i);
      (*peVar1->_vptr_logger[8])
                (peVar1,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                 ,"enable_hb_for_peer",0x25,&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p);
      }
    }
  }
  schedule_task(this,&p->hb_task_,(p->current_hb_interval_).super___atomic_base<int>._M_i);
  return;
}

Assistant:

void raft_server::enable_hb_for_peer(peer& p) {
    p.enable_hb(true);
    p.resume_hb_speed();
    p_tr("peer %d, interval: %d\n", p.get_id(), p.get_current_hb_interval());
    schedule_task(p.get_hb_task(), p.get_current_hb_interval());
}